

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

void __thiscall btSymMatrix<int>::resize(btSymMatrix<int> *this,int n,int *init)

{
  this->dim = n;
  btAlignedObjectArray<int>::resize(&this->store,((n + 1) * n) / 2,init);
  return;
}

Assistant:

void					resize(int n,const T& init=T())			{ dim=n;store.resize((n*(n+1))/2,init); }